

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_0::CopiesAndBlittingTestInstance::uploadImageAspect
          (CopiesAndBlittingTestInstance *this,ConstPixelBufferAccess *imageAccess,VkImage *image,
          ImageParms *parms)

{
  deUint64 dVar1;
  VkCommandBuffer_s *pVVar2;
  undefined8 uVar3;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  RefData<vk::Handle<(vk::HandleType)8>_> data_00;
  deUint32 *pdVar4;
  VkQueue pVVar5;
  VkQueue device;
  VkDevice pVVar6;
  VkResult VVar7;
  VkImageAspectFlags VVar8;
  Handle<(vk::HandleType)8> *pHVar9;
  Allocation *pAVar10;
  VkDeviceSize VVar11;
  TextureFormat format;
  TextureFormat *pTVar12;
  void *dst;
  void *src;
  VkCommandBuffer_s **ppVVar13;
  VkAllocationCallbacks *this_00;
  bool bVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  deUint32 *local_3d0;
  undefined8 uStack_2f8;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  undefined8 local_2c8;
  VkBufferImageCopy copyRegion;
  VkImageMemoryBarrier postImageBarrier;
  VkImageMemoryBarrier preImageBarrier;
  bool skipPreImageBarrier;
  undefined4 local_1e8;
  VkImageAspectFlags formatAspect;
  VkBufferMemoryBarrier preBufferBarrier;
  VkMemoryRequirements local_190;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_178;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_168;
  Move<vk::Handle<(vk::HandleType)8>_> local_158;
  RefData<vk::Handle<(vk::HandleType)8>_> local_138;
  undefined1 local_118 [8];
  VkBufferCreateInfo bufferParams;
  deUint32 local_d8;
  VkExtent3D imageExtent;
  deUint32 arraySize;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> bufferAlloc;
  ConstPixelBufferAccess local_a0;
  deUint32 local_74;
  undefined1 local_70 [4];
  deUint32 bufferSize;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  Allocator *memAlloc;
  VkQueue pVStack_40;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice vkDevice;
  DeviceInterface *vk;
  ImageParms *parms_local;
  VkImage *image_local;
  ConstPixelBufferAccess *imageAccess_local;
  CopiesAndBlittingTestInstance *this_local;
  
  vk = (DeviceInterface *)parms;
  parms_local = (ImageParms *)image;
  image_local = (VkImage *)imageAccess;
  imageAccess_local = (ConstPixelBufferAccess *)this;
  vkDevice = (VkDevice)Context::getDeviceInterface((this->super_TestInstance).m_context);
  queue = (VkQueue)Context::getDevice((this->super_TestInstance).m_context);
  pVStack_40 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  memAlloc._4_4_ = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)Context::getDefaultAllocator((this->super_TestInstance).m_context);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)local_70);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_a0,(ConstPixelBufferAccess *)image_local);
  local_74 = calculateSize(this,&local_a0);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&imageExtent.depth);
  imageExtent.height = getArraySize((ImageParms *)vk);
  join_0x00000010_0x00000000_ = getExtent3D((ImageParms *)vk);
  imageExtent.width = local_d8;
  pdVar4 = bufferParams.pQueueFamilyIndices;
  local_118._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferParams._4_4_ = 0;
  bufferParams.pNext._0_4_ = 0;
  bufferParams._16_8_ = ZEXT48(local_74);
  bufferParams.size._0_4_ = 1;
  bufferParams.size._4_4_ = 0;
  bufferParams.usage = 1;
  bufferParams._40_8_ = (long)&memAlloc + 4;
  ::vk::createBuffer(&local_158,(DeviceInterface *)vkDevice,(VkDevice)queue,
                     (VkBufferCreateInfo *)local_118,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_138,(Move *)&local_158);
  uVar15 = SUB84(local_138.deleter.m_deviceIface,0);
  uVar16 = (undefined4)((ulong)local_138.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_deviceIface._0_4_ = uVar15;
  data_00.object.m_internal = local_138.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = uVar16;
  data_00.deleter.m_device = local_138.deleter.m_device;
  data_00.deleter.m_allocator._0_4_ = (int)local_138.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_138.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)8>_> *)local_70,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_158);
  pVVar6 = vkDevice;
  pVVar5 = queue;
  this_00 = buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_70);
  ::vk::getBufferMemoryRequirements
            (&local_190,(DeviceInterface *)pVVar6,(VkDevice)pVVar5,(VkBuffer)pHVar9->m_internal);
  (**(code **)((long)this_00->pUserData + 0x18))
            (&local_178,this_00,&local_190,::vk::MemoryRequirement::HostVisible);
  local_168 = de::details::MovePtr::operator_cast_to_PtrData(&local_178,(MovePtr *)this_00);
  data._8_4_ = uVar15;
  data.ptr = (Allocation *)local_138.object.m_internal;
  data._12_4_ = uVar16;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&imageExtent.depth,data
            );
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_178);
  pVVar6 = vkDevice;
  pVVar5 = queue;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_70);
  dVar1 = pHVar9->m_internal;
  pAVar10 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                       &imageExtent.depth);
  preBufferBarrier.size = (VkDeviceSize)::vk::Allocation::getMemory(pAVar10);
  pAVar10 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                       &imageExtent.depth);
  VVar11 = ::vk::Allocation::getOffset(pAVar10);
  VVar7 = (**(code **)(*(long *)pVVar6 + 0x60))(pVVar6,pVVar5,dVar1,preBufferBarrier.size,VVar11);
  ::vk::checkResult(VVar7,
                    "vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x16c);
  local_1e8 = 0x2c;
  preBufferBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  preBufferBarrier._4_4_ = 0;
  preBufferBarrier.pNext._0_4_ = 0x4000;
  preBufferBarrier.pNext._4_4_ = 0x800;
  preBufferBarrier.srcAccessMask = 0xffffffff;
  preBufferBarrier.dstAccessMask = 0xffffffff;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_70);
  preBufferBarrier._24_8_ = pHVar9->m_internal;
  preBufferBarrier.buffer.m_internal = 0;
  preBufferBarrier.offset = (VkDeviceSize)local_74;
  format = ::vk::mapVkFormat(*(VkFormat *)((long)&vk->_vptr_DeviceInterface + 4));
  postImageBarrier.image.m_internal._0_4_ = getAspectFlags(format);
  bVar14 = false;
  if ((VkImageAspectFlags)postImageBarrier.image.m_internal == 6) {
    pTVar12 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)image_local);
    VVar8 = getAspectFlags(*pTVar12);
    bVar14 = VVar8 == 4;
  }
  postImageBarrier.subresourceRange.layerCount = 0x2d;
  copyRegion.imageExtent.height = 0x2d;
  postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  postImageBarrier._4_4_ = 0;
  postImageBarrier.pNext._0_4_ = 0x1000;
  postImageBarrier.pNext._4_4_ = 0x1000;
  postImageBarrier.srcAccessMask = 7;
  postImageBarrier.dstAccessMask = 7;
  postImageBarrier.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  postImageBarrier.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  postImageBarrier.srcQueueFamilyIndex = parms_local->imageType;
  postImageBarrier.dstQueueFamilyIndex = parms_local->format;
  postImageBarrier.image.m_internal._4_4_ = 0;
  postImageBarrier.subresourceRange.aspectMask = 1;
  postImageBarrier.subresourceRange.baseMipLevel = 0;
  postImageBarrier.subresourceRange.levelCount = imageExtent.height;
  local_2c8 = 0;
  copyRegion.bufferOffset._0_4_ =
       tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)image_local);
  copyRegion.bufferOffset._4_4_ =
       tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)image_local);
  pTVar12 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)image_local);
  copyRegion.bufferRowLength = getAspectFlags(*pTVar12);
  copyRegion.bufferImageHeight = 0;
  copyRegion.imageSubresource.aspectMask = 0;
  copyRegion.imageSubresource.mipLevel = imageExtent.height;
  copyRegion.imageSubresource.baseArrayLayer = 0;
  copyRegion.imageSubresource.layerCount = 0;
  copyRegion.imageOffset.x = 0;
  copyRegion.imageExtent.width = imageExtent.width;
  copyRegion.imageOffset._4_8_ = pdVar4;
  pAVar10 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                       &imageExtent.depth);
  dst = ::vk::Allocation::getHostPtr(pAVar10);
  src = tcu::ConstPixelBufferAccess::getDataPtr((ConstPixelBufferAccess *)image_local);
  ::deMemcpy(dst,src,(ulong)local_74);
  pVVar6 = vkDevice;
  pVVar5 = queue;
  pAVar10 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                       &imageExtent.depth);
  cmdBufferBeginInfo.pInheritanceInfo =
       (VkCommandBufferInheritanceInfo *)::vk::Allocation::getMemory(pAVar10);
  pAVar10 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                       &imageExtent.depth);
  VVar11 = ::vk::Allocation::getOffset(pAVar10);
  ::vk::flushMappedMemoryRange
            ((DeviceInterface *)pVVar6,(VkDevice)pVVar5,
             (VkDeviceMemory)cmdBufferBeginInfo.pInheritanceInfo,VVar11,(ulong)local_74);
  pVVar6 = vkDevice;
  cmdBufferBeginInfo.pNext = (void *)0x1;
  cmdBufferBeginInfo.flags = 0;
  cmdBufferBeginInfo._20_4_ = 0;
  uStack_2f8 = 0x2a;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar7 = (**(code **)(*(long *)pVVar6 + 0x248))(pVVar6,*ppVVar13,&uStack_2f8);
  ::vk::checkResult(VVar7,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x1c4);
  pVVar6 = vkDevice;
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  if (!bVar14) {
    local_3d0 = &postImageBarrier.subresourceRange.layerCount;
  }
  else {
    local_3d0 = (deUint32 *)0x0;
  }
  (**(code **)(*(long *)pVVar6 + 0x368))
            (pVVar6,*ppVVar13,0x4000,0x1000,0,0,0,1,&local_1e8,!bVar14,local_3d0);
  pVVar6 = vkDevice;
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar13;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_70);
  uVar3._0_4_ = parms_local->imageType;
  uVar3._4_4_ = parms_local->format;
  (**(code **)(*(long *)pVVar6 + 0x310))(pVVar6,pVVar2,pHVar9->m_internal,uVar3,7,1,&local_2c8);
  pVVar6 = vkDevice;
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (**(code **)(*(long *)pVVar6 + 0x368))
            (pVVar6,*ppVVar13,0x1000,1,0,0,0,0,0,1,&copyRegion.imageExtent.height);
  pVVar6 = vkDevice;
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar7 = (**(code **)(*(long *)pVVar6 + 0x250))(pVVar6,*ppVVar13);
  ::vk::checkResult(VVar7,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x1c9);
  pVVar6 = vkDevice;
  device = queue;
  pVVar5 = pVStack_40;
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  submitCommandsAndWait(this,(DeviceInterface *)pVVar6,(VkDevice)device,pVVar5,ppVVar13);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&imageExtent.depth);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)local_70);
  return;
}

Assistant:

void CopiesAndBlittingTestInstance::uploadImageAspect (const tcu::ConstPixelBufferAccess& imageAccess, const VkImage& image, const ImageParms& parms)
{
	const DeviceInterface&		vk					= m_context.getDeviceInterface();
	const VkDevice				vkDevice			= m_context.getDevice();
	const VkQueue				queue				= m_context.getUniversalQueue();
	const deUint32				queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&					memAlloc			= m_context.getDefaultAllocator();
	Move<VkBuffer>				buffer;
	const deUint32				bufferSize			= calculateSize(imageAccess);
	de::MovePtr<Allocation>		bufferAlloc;
	const deUint32				arraySize			= getArraySize(parms);
	const VkExtent3D			imageExtent			= getExtent3D(parms);

	// Create source buffer
	{
		const VkBufferCreateInfo			bufferParams			=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			bufferSize,									// VkDeviceSize			size;
			VK_BUFFER_USAGE_TRANSFER_SRC_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex,							// const deUint32*		pQueueFamilyIndices;
		};

		buffer		= createBuffer(vk, vkDevice, &bufferParams);
		bufferAlloc = memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *buffer), MemoryRequirement::HostVisible);
		VK_CHECK(vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset()));
	}

	// Barriers for copying buffer to image
	const VkBufferMemoryBarrier				preBufferBarrier		=
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,		// VkStructureType	sType;
		DE_NULL,										// const void*		pNext;
		VK_ACCESS_HOST_WRITE_BIT,						// VkAccessFlags	srcAccessMask;
		VK_ACCESS_TRANSFER_READ_BIT,					// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32			dstQueueFamilyIndex;
		*buffer,										// VkBuffer			buffer;
		0u,												// VkDeviceSize		offset;
		bufferSize										// VkDeviceSize		size;
	};

	const VkImageAspectFlags				formatAspect			= getAspectFlags(mapVkFormat(parms.format));
	const bool								skipPreImageBarrier		= formatAspect == (VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT) &&
																	  getAspectFlags(imageAccess.getFormat()) == VK_IMAGE_ASPECT_STENCIL_BIT;
	const VkImageMemoryBarrier				preImageBarrier			=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		0u,												// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		image,											// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			formatAspect,	// VkImageAspectFlags	aspect;
			0u,				// deUint32				baseMipLevel;
			1u,				// deUint32				mipLevels;
			0u,				// deUint32				baseArraySlice;
			arraySize,		// deUint32				arraySize;
		}
	};

	const VkImageMemoryBarrier				postImageBarrier		=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		image,											// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			formatAspect,				// VkImageAspectFlags	aspect;
			0u,							// deUint32				baseMipLevel;
			1u,							// deUint32				mipLevels;
			0u,							// deUint32				baseArraySlice;
			arraySize,					// deUint32				arraySize;
		}
	};

	const VkBufferImageCopy		copyRegion		=
	{
		0u,												// VkDeviceSize				bufferOffset;
		(deUint32)imageAccess.getWidth(),				// deUint32					bufferRowLength;
		(deUint32)imageAccess.getHeight(),				// deUint32					bufferImageHeight;
		{
			getAspectFlags(imageAccess.getFormat()),		// VkImageAspectFlags	aspect;
			0u,												// deUint32				mipLevel;
			0u,												// deUint32				baseArrayLayer;
			arraySize,										// deUint32				layerCount;
		},												// VkImageSubresourceLayers	imageSubresource;
		{ 0, 0, 0 },									// VkOffset3D				imageOffset;
		imageExtent										// VkExtent3D				imageExtent;
	};

	// Write buffer data
	deMemcpy(bufferAlloc->getHostPtr(), imageAccess.getDataPtr(), bufferSize);
	flushMappedMemoryRange(vk, vkDevice, bufferAlloc->getMemory(), bufferAlloc->getOffset(), bufferSize);

	// Copy buffer to image
	const VkCommandBufferBeginInfo			cmdBufferBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,			// VkStructureType					sType;
		DE_NULL,												// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,			// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL,
						  1, &preBufferBarrier, (skipPreImageBarrier ? 0 : 1), (skipPreImageBarrier ? DE_NULL : &preImageBarrier));
	vk.cmdCopyBufferToImage(*m_cmdBuffer, *buffer, image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1u, &copyRegion);
	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &postImageBarrier);
	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));

	submitCommandsAndWait(vk, vkDevice, queue, *m_cmdBuffer);
}